

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O0

void __thiscall xercesc_4_0::ElemStack::addPrefix(ElemStack *this,XMLCh *prefixToAdd,uint uriId)

{
  StackElem *toExpand;
  uint uVar1;
  EmptyStackException *this_00;
  uint prefId;
  StackElem *curRow;
  uint uriId_local;
  XMLCh *prefixToAdd_local;
  ElemStack *this_local;
  
  if (this->fStackTop == 0) {
    this_00 = (EmptyStackException *)__cxa_allocate_exception(0x30);
    EmptyStackException::EmptyStackException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ElemStack.cpp"
               ,0x13a,ElemStack_EmptyStack,this->fMemoryManager);
    __cxa_throw(this_00,&EmptyStackException::typeinfo,EmptyStackException::~EmptyStackException);
  }
  toExpand = this->fStack[this->fStackTop - 1];
  uVar1 = XMLStringPool::addOrFind(&this->fPrefixPool,prefixToAdd);
  if (toExpand->fMapCount == toExpand->fMapCapacity) {
    expandMap(this,toExpand);
  }
  toExpand->fMap[toExpand->fMapCount].fPrefId = uVar1;
  if ((uVar1 == this->fGlobalPoolId) && (uriId == this->fEmptyNamespaceId)) {
    toExpand->fMap[toExpand->fMapCount].fURIId = this->fEmptyNamespaceId;
  }
  else {
    toExpand->fMap[toExpand->fMapCount].fURIId = uriId;
  }
  toExpand->fMapCount = toExpand->fMapCount + 1;
  return;
}

Assistant:

void ElemStack::addPrefix(  const   XMLCh* const    prefixToAdd
                            , const unsigned int    uriId)
{
    if (!fStackTop)
        ThrowXMLwithMemMgr(EmptyStackException, XMLExcepts::ElemStack_EmptyStack, fMemoryManager);

    // Get a convenience pointer to the stack top row
    StackElem* curRow = fStack[fStackTop - 1];

    // Map the prefix to its unique id
    const unsigned int prefId = fPrefixPool.addOrFind(prefixToAdd);

    //
    //  Add a new element to the prefix map for this element. If its full,
    //  then expand it out.
    //
    if (curRow->fMapCount == curRow->fMapCapacity)
        expandMap(curRow);

    //
    //  And now add a new element for this prefix. Watch for the special case
    //  of xmlns=="", and force it to ""=[globalid]
    //
    curRow->fMap[curRow->fMapCount].fPrefId = prefId;
    if ((prefId == fGlobalPoolId) && (uriId == fEmptyNamespaceId))
        curRow->fMap[curRow->fMapCount].fURIId = fEmptyNamespaceId;
    else
        curRow->fMap[curRow->fMapCount].fURIId = uriId;

    // Bump the map count now
    curRow->fMapCount++;
}